

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

char * map_enum(enum_map_t *map,uint32_t value)

{
  long local_28;
  size_t i;
  uint32_t value_local;
  enum_map_t *map_local;
  
  local_28 = 0;
  while( true ) {
    if (map[local_28].value == 0xffffffff) {
      snprintf(map_enum::unknown,0x10,"unknown (%u)",(ulong)value);
      map_enum::unknown[0xf] = '\0';
      return map_enum::unknown;
    }
    if (map[local_28].value == value) break;
    local_28 = local_28 + 1;
  }
  return map[local_28].name;
}

Assistant:

static const char *
map_enum(const enum_map_t *map, uint32_t value) {
    static char unknown[16];
    size_t i = 0;

    while (map[i].value < UINT32_MAX) {
        if (map[i].value == value) {
            return map[i].name;
        }
        i++;
    }

    snprintf(unknown, sizeof(unknown), "unknown (%u)", value);
    unknown[sizeof(unknown) - 1] = '\0';

    return unknown;
}